

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::DecodeURL(string *__return_storage_ptr__,string *url)

{
  bool bVar1;
  ulong uVar2;
  undefined1 *puVar3;
  ulong uVar4;
  char *pcVar5;
  char local_127;
  undefined1 local_126;
  undefined1 local_125;
  char bytes [3];
  string local_118;
  ulong local_f8;
  size_t i;
  undefined1 local_e8 [8];
  RegularExpression urlByteRe;
  string *url_local;
  string *ret;
  
  urlByteRe._200_8_ = url;
  RegularExpression::RegularExpression((RegularExpression *)local_e8,"%[0-9a-fA-F][0-9a-fA-F]");
  i._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_f8 = 0; uVar4 = local_f8, uVar2 = std::__cxx11::string::length(), uVar4 < uVar2;
      local_f8 = local_f8 + 1) {
    std::__cxx11::string::substr((ulong)&local_118,urlByteRe._200_8_);
    bVar1 = RegularExpression::find((RegularExpression *)local_e8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (bVar1) {
      pcVar5 = (char *)std::__cxx11::string::operator[](urlByteRe._200_8_);
      local_127 = *pcVar5;
      puVar3 = (undefined1 *)std::__cxx11::string::operator[](urlByteRe._200_8_);
      local_126 = *puVar3;
      local_125 = 0;
      uVar4 = strtoul(&local_127,(char **)0x0,0x10);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)uVar4);
      local_f8 = local_f8 + 2;
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[](urlByteRe._200_8_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar5);
    }
  }
  i._7_1_ = 1;
  RegularExpression::~RegularExpression((RegularExpression *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::DecodeURL(const std::string& url)
{
  kwsys::RegularExpression urlByteRe(VTK_URL_BYTE_REGEX);
  std::string ret;
  for (size_t i = 0; i < url.length(); i++) {
    if (urlByteRe.find(url.substr(i, 3))) {
      char bytes[] = { url[i + 1], url[i + 2], '\0' };
      ret += static_cast<char>(strtoul(bytes, nullptr, 16));
      i += 2;
    } else {
      ret += url[i];
    }
  }
  return ret;
}